

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_reader_set_fill(mpack_reader_t *reader,mpack_reader_fill_t fill)

{
  mpack_reader_fill_t fill_local;
  mpack_reader_t *reader_local;
  
  if (reader->size == 0) {
    mpack_reader_flag_error(reader,mpack_error_bug);
  }
  else if (reader->size < 0x20) {
    mpack_reader_flag_error(reader,mpack_error_bug);
  }
  else {
    reader->fill = fill;
  }
  return;
}

Assistant:

void mpack_reader_set_fill(mpack_reader_t* reader, mpack_reader_fill_t fill) {
    MPACK_STATIC_ASSERT(MPACK_READER_MINIMUM_BUFFER_SIZE >= MPACK_MAXIMUM_TAG_SIZE,
            "minimum buffer size must fit any tag!");

    if (reader->size == 0) {
        mpack_break("cannot use fill function without a writeable buffer!");
        mpack_reader_flag_error(reader, mpack_error_bug);
        return;
    }

    if (reader->size < MPACK_READER_MINIMUM_BUFFER_SIZE) {
        mpack_break("buffer size is %i, but minimum buffer size for fill is %i",
                (int)reader->size, MPACK_READER_MINIMUM_BUFFER_SIZE);
        mpack_reader_flag_error(reader, mpack_error_bug);
        return;
    }

    reader->fill = fill;
}